

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

msgpack_unpack_return
msgpack_unpack(char *data,size_t len,size_t *off,msgpack_zone *result_zone,msgpack_object *result)

{
  size_t sVar1;
  msgpack_object local_880;
  undefined1 local_868 [8];
  template_context ctx;
  size_t *psStack_40;
  int e;
  size_t noff;
  msgpack_object *result_local;
  msgpack_zone *result_zone_local;
  size_t *off_local;
  size_t len_local;
  char *data_local;
  
  psStack_40 = (size_t *)0x0;
  if (off != (size_t *)0x0) {
    psStack_40 = (size_t *)*off;
  }
  if (psStack_40 < len) {
    noff = (size_t)result;
    result_local = (msgpack_object *)result_zone;
    result_zone_local = (msgpack_zone *)off;
    off_local = (size_t *)len;
    len_local = (size_t)data;
    template_init((template_context *)local_868);
    local_868 = (undefined1  [8])result_local;
    ctx.user.z._0_1_ = 0;
    ctx.stack[0x1f].map_key.via._12_4_ =
         template_execute((template_context *)local_868,(char *)len_local,(size_t)off_local,
                          (size_t *)&stack0xffffffffffffffc0);
    sVar1 = noff;
    data_local._4_4_ = ctx.stack[0x1f].map_key.via._12_4_;
    if (MSGPACK_UNPACK_PARSE_ERROR < ctx.stack[0x1f].map_key.via._12_4_) {
      if (result_zone_local != (msgpack_zone *)0x0) {
        (result_zone_local->chunk_list).free = (size_t)psStack_40;
      }
      if (ctx.stack[0x1f].map_key.via._12_4_ == MSGPACK_UNPACK_CONTINUE) {
        data_local._4_4_ = MSGPACK_UNPACK_CONTINUE;
      }
      else {
        template_data(&local_880,(template_context *)local_868);
        *(undefined8 *)sVar1 = local_880._0_8_;
        *(uint64_t *)(sVar1 + 8) = local_880.via.u64;
        *(msgpack_object **)(sVar1 + 0x10) = local_880.via.array.ptr;
        if (psStack_40 < off_local) {
          data_local._4_4_ = MSGPACK_UNPACK_EXTRA_BYTES;
        }
        else {
          data_local._4_4_ = MSGPACK_UNPACK_SUCCESS;
        }
      }
    }
  }
  else {
    data_local._4_4_ = MSGPACK_UNPACK_CONTINUE;
  }
  return data_local._4_4_;
}

Assistant:

msgpack_unpack_return
msgpack_unpack(const char* data, size_t len, size_t* off,
        msgpack_zone* result_zone, msgpack_object* result)
{
    size_t noff = 0;
    if(off != NULL) { noff = *off; }

    if(len <= noff) {
        // FIXME
        return MSGPACK_UNPACK_CONTINUE;
    }
    else {
        int e;
        template_context ctx;
        template_init(&ctx);

        ctx.user.z = result_zone;
        ctx.user.referenced = false;

        e = template_execute(&ctx, data, len, &noff);
        if(e < 0) {
            return e;
        }

        if(off != NULL) { *off = noff; }

        if(e == 0) {
            return MSGPACK_UNPACK_CONTINUE;
        }

        *result = template_data(&ctx);

        if(noff < len) {
            return MSGPACK_UNPACK_EXTRA_BYTES;
        }

        return MSGPACK_UNPACK_SUCCESS;
    }
}